

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ExtensionRangeOptions::ExtensionRangeOptions(ExtensionRangeOptions *this)

{
  undefined8 *in_RDI;
  ExtensionSet *in_stack_00000020;
  Arena *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffc0;
  
  Message::Message(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__ExtensionRangeOptions_009583f0;
  internal::ExtensionSet::ExtensionSet(in_stack_00000020);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)(in_RDI + 4),in_stack_ffffffffffffffb8);
  memset(in_RDI + 5,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x508707);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x508719);
  SharedCtor((ExtensionRangeOptions *)0x508725);
  return;
}

Assistant:

ExtensionRangeOptions::ExtensionRangeOptions()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.ExtensionRangeOptions)
}